

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

string * lest::make_value_string<unsigned_long>(string *__return_storage_ptr__,unsigned_long *value)

{
  ostringstream os;
  char *local_1b0;
  size_type local_1a8;
  char local_1a0;
  undefined7 uStack_19f;
  undefined8 uStack_198;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1b0 == &local_1a0) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_19f,local_1a0);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_198;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1b0;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_19f,local_1a0);
  }
  __return_storage_ptr__->_M_string_length = local_1a8;
  local_1a8 = 0;
  local_1a0 = '\0';
  local_1b0 = &local_1a0;
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

auto make_value_string( T const & value ) -> std::string
{
    std::ostringstream os; os << value; return os.str();
}